

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O3

aiReturn __thiscall aiMaterial::RemoveProperty(aiMaterial *this,char *pKey,uint type,uint index)

{
  aiMaterialProperty **ppaVar1;
  aiMaterialProperty *paVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (pKey == (char *)0x0) {
    __assert_fail("nullptr != pKey",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1bb,
                  "aiReturn aiMaterial::RemoveProperty(const char *, unsigned int, unsigned int)");
  }
  uVar5 = (ulong)this->mNumProperties;
  bVar7 = true;
  if (uVar5 != 0) {
    ppaVar1 = this->mProperties;
    uVar6 = 0;
    bVar7 = false;
    do {
      paVar2 = ppaVar1[uVar6];
      if ((((paVar2 != (aiMaterialProperty *)0x0) &&
           (iVar3 = strcmp((paVar2->mKey).data,pKey), iVar3 == 0)) && (paVar2->mSemantic == type))
         && (paVar2->mIndex == index)) {
        if (paVar2->mData != (char *)0x0) {
          operator_delete__(paVar2->mData);
        }
        operator_delete(paVar2);
        uVar4 = this->mNumProperties - 1;
        this->mNumProperties = uVar4;
        if ((uint)uVar6 < uVar4) {
          do {
            this->mProperties[uVar6] = this->mProperties[uVar6 + 1];
            uVar6 = uVar6 + 1;
          } while (uVar6 < this->mNumProperties);
        }
        goto LAB_0039bb9d;
      }
      uVar6 = uVar6 + 1;
      bVar7 = uVar5 <= uVar6;
    } while (uVar6 != uVar5);
    bVar7 = true;
  }
LAB_0039bb9d:
  return -(uint)bVar7;
}

Assistant:

aiReturn aiMaterial::RemoveProperty ( const char* pKey,unsigned int type, unsigned int index )
{
    ai_assert( nullptr != pKey );

    for (unsigned int i = 0; i < mNumProperties;++i) {
        aiMaterialProperty* prop = mProperties[i];

        if (prop && !strcmp( prop->mKey.data, pKey ) &&
            prop->mSemantic == type && prop->mIndex == index)
        {
            // Delete this entry
            delete mProperties[i];

            // collapse the array behind --.
            --mNumProperties;
            for (unsigned int a = i; a < mNumProperties;++a)    {
                mProperties[a] = mProperties[a+1];
            }
            return AI_SUCCESS;
        }
    }

    return AI_FAILURE;
}